

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O0

void lex_scan_string(lex_t *lex,json_error_t *error)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  uint local_44;
  int32_t value2;
  int32_t value;
  size_t length;
  char *pcStack_30;
  int i;
  char *t;
  char *p;
  json_error_t *pjStack_18;
  int c;
  json_error_t *error_local;
  lex_t *lex_local;
  
  (lex->value).string.val = (char *)0x0;
  lex->token = -1;
  pjStack_18 = error;
  error_local = (json_error_t *)lex;
  p._4_4_ = lex_get_save(lex,error);
  while (p._4_4_ != 0x22) {
    if (p._4_4_ == 0xfffffffe) goto LAB_0011ec9d;
    if (p._4_4_ == 0xffffffff) {
      error_set(pjStack_18,(lex_t *)error_local,json_error_premature_end_of_input,
                "premature end of input");
      goto LAB_0011ec9d;
    }
    if ((-1 < (int)p._4_4_) && ((int)p._4_4_ < 0x20)) {
      lex_unget_unsave((lex_t *)error_local,p._4_4_);
      if (p._4_4_ == 10) {
        error_set(pjStack_18,(lex_t *)error_local,json_error_invalid_syntax,"unexpected newline");
      }
      else {
        error_set(pjStack_18,(lex_t *)error_local,json_error_invalid_syntax,"control character 0x%x"
                  ,(ulong)p._4_4_);
      }
      goto LAB_0011ec9d;
    }
    if (p._4_4_ == 0x5c) {
      p._4_4_ = lex_get_save((lex_t *)error_local,pjStack_18);
      if (p._4_4_ == 0x75) {
        p._4_4_ = lex_get_save((lex_t *)error_local,pjStack_18);
        for (length._4_4_ = 0; length._4_4_ < 4; length._4_4_ = length._4_4_ + 1) {
          if (((((int)p._4_4_ < 0x30) || (0x39 < (int)p._4_4_)) &&
              (((int)p._4_4_ < 0x41 || (0x46 < (int)p._4_4_)))) &&
             (((int)p._4_4_ < 0x61 || (0x66 < (int)p._4_4_)))) {
            error_set(pjStack_18,(lex_t *)error_local,json_error_invalid_syntax,"invalid escape");
            goto LAB_0011ec9d;
          }
          p._4_4_ = lex_get_save((lex_t *)error_local,pjStack_18);
        }
      }
      else {
        if (((((p._4_4_ != 0x22) && (p._4_4_ != 0x5c)) && (p._4_4_ != 0x2f)) &&
            ((p._4_4_ != 0x62 && (p._4_4_ != 0x66)))) &&
           ((p._4_4_ != 0x6e && ((p._4_4_ != 0x72 && (p._4_4_ != 0x74)))))) {
          error_set(pjStack_18,(lex_t *)error_local,json_error_invalid_syntax,"invalid escape");
          goto LAB_0011ec9d;
        }
        p._4_4_ = lex_get_save((lex_t *)error_local,pjStack_18);
      }
    }
    else {
      p._4_4_ = lex_get_save((lex_t *)error_local,pjStack_18);
    }
  }
  pcStack_30 = (char *)jsonp_malloc(*(long *)(error_local->source + 0x34) + 1);
  if (pcStack_30 == (char *)0x0) {
LAB_0011ec9d:
    lex_free_string((lex_t *)error_local);
  }
  else {
    *(char **)(error_local->text + 0xc) = pcStack_30;
    pcVar4 = strbuffer_value((strbuffer_t *)(error_local->source + 0x2c));
    t = pcVar4 + 1;
    while (*t != '\"') {
      if (*t == '\\') {
        pcVar4 = t + 1;
        if (*pcVar4 == 'u') {
          t = pcVar4;
          local_44 = decode_unicode_escape(pcVar4);
          if ((int)local_44 < 0) {
            error_set(pjStack_18,(lex_t *)error_local,json_error_invalid_syntax,
                      "invalid Unicode escape \'%.6s\'",t + -1);
            goto LAB_0011ec9d;
          }
          pcVar4 = t + 5;
          if (((int)local_44 < 0xd800) || (0xdbff < (int)local_44)) {
            t = pcVar4;
            if ((0xdbff < (int)local_44) && ((int)local_44 < 0xe000)) {
              error_set(pjStack_18,(lex_t *)error_local,json_error_invalid_syntax,
                        "invalid Unicode \'\\u%04X\'",(ulong)local_44);
              goto LAB_0011ec9d;
            }
          }
          else {
            if ((*pcVar4 != '\\') || (t[6] != 'u')) {
              t = pcVar4;
              error_set(pjStack_18,(lex_t *)error_local,json_error_invalid_syntax,
                        "invalid Unicode \'\\u%04X\'",(ulong)local_44);
              goto LAB_0011ec9d;
            }
            t = t + 6;
            uVar2 = decode_unicode_escape(t);
            if ((int)uVar2 < 0) {
              error_set(pjStack_18,(lex_t *)error_local,json_error_invalid_syntax,
                        "invalid Unicode escape \'%.6s\'",t + -1);
              goto LAB_0011ec9d;
            }
            t = t + 5;
            if (((int)uVar2 < 0xdc00) || (0xdfff < (int)uVar2)) {
              error_set(pjStack_18,(lex_t *)error_local,json_error_invalid_syntax,
                        "invalid Unicode \'\\u%04X\\u%04X\'",(ulong)local_44,(ulong)uVar2);
              goto LAB_0011ec9d;
            }
            local_44 = (local_44 - 0xd800) * 0x400 + uVar2 + 0x2400;
          }
          iVar3 = utf8_encode(local_44,pcStack_30,(size_t *)&value2);
          if (iVar3 != 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/jansson/load.c"
                          ,0x19e,"void lex_scan_string(lex_t *, json_error_t *)");
          }
          pcStack_30 = pcStack_30 + _value2;
        }
        else {
          cVar1 = *pcVar4;
          if (((cVar1 == '\"') || (cVar1 == '/')) || (cVar1 == '\\')) {
            *pcStack_30 = *pcVar4;
          }
          else if (cVar1 == 'b') {
            *pcStack_30 = '\b';
          }
          else if (cVar1 == 'f') {
            *pcStack_30 = '\f';
          }
          else if (cVar1 == 'n') {
            *pcStack_30 = '\n';
          }
          else if (cVar1 == 'r') {
            *pcStack_30 = '\r';
          }
          else {
            if (cVar1 != 't') {
              t = pcVar4;
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/jansson/load.c"
                            ,0x1b7,"void lex_scan_string(lex_t *, json_error_t *)");
            }
            *pcStack_30 = '\t';
          }
          pcStack_30 = pcStack_30 + 1;
          t = t + 2;
        }
      }
      else {
        *pcStack_30 = *t;
        pcStack_30 = pcStack_30 + 1;
        t = t + 1;
      }
    }
    *pcStack_30 = '\0';
    *(long *)(error_local->text + 0x14) = (long)pcStack_30 - *(long *)(error_local->text + 0xc);
    error_local->text[4] = '\0';
    error_local->text[5] = '\x01';
    error_local->text[6] = '\0';
    error_local->text[7] = '\0';
  }
  return;
}

Assistant:

static void lex_scan_string(lex_t *lex, json_error_t *error) {
    int c;
    const char *p;
    char *t;
    int i;

    lex->value.string.val = NULL;
    lex->token = TOKEN_INVALID;

    c = lex_get_save(lex, error);

    while (c != '"') {
        if (c == STREAM_STATE_ERROR)
            goto out;

        else if (c == STREAM_STATE_EOF) {
            error_set(error, lex, json_error_premature_end_of_input,
                      "premature end of input");
            goto out;
        } else if (0 <= c && c <= 0x1F) {
            /* control character */
            lex_unget_unsave(lex, c);
            if (c == '\n')
                error_set(error, lex, json_error_invalid_syntax, "unexpected newline");
            else
                error_set(error, lex, json_error_invalid_syntax, "control character 0x%x",
                          c);
            goto out;
        } else if (c == '\\') {
            c = lex_get_save(lex, error);
            if (c == 'u') {
                c = lex_get_save(lex, error);
                for (i = 0; i < 4; i++) {
                    if (!l_isxdigit(c)) {
                        error_set(error, lex, json_error_invalid_syntax,
                                  "invalid escape");
                        goto out;
                    }
                    c = lex_get_save(lex, error);
                }
            } else if (c == '"' || c == '\\' || c == '/' || c == 'b' || c == 'f' ||
                       c == 'n' || c == 'r' || c == 't')
                c = lex_get_save(lex, error);
            else {
                error_set(error, lex, json_error_invalid_syntax, "invalid escape");
                goto out;
            }
        } else
            c = lex_get_save(lex, error);
    }

    /* the actual value is at most of the same length as the source
       string, because:
         - shortcut escapes (e.g. "\t") (length 2) are converted to 1 byte
         - a single \uXXXX escape (length 6) is converted to at most 3 bytes
         - two \uXXXX escapes (length 12) forming an UTF-16 surrogate pair
           are converted to 4 bytes
    */
    t = jsonp_malloc(lex->saved_text.length + 1);
    if (!t) {
        /* this is not very nice, since TOKEN_INVALID is returned */
        goto out;
    }
    lex->value.string.val = t;

    /* + 1 to skip the " */
    p = strbuffer_value(&lex->saved_text) + 1;

    while (*p != '"') {
        if (*p == '\\') {
            p++;
            if (*p == 'u') {
                size_t length;
                int32_t value;

                value = decode_unicode_escape(p);
                if (value < 0) {
                    error_set(error, lex, json_error_invalid_syntax,
                              "invalid Unicode escape '%.6s'", p - 1);
                    goto out;
                }
                p += 5;

                if (0xD800 <= value && value <= 0xDBFF) {
                    /* surrogate pair */
                    if (*p == '\\' && *(p + 1) == 'u') {
                        int32_t value2 = decode_unicode_escape(++p);
                        if (value2 < 0) {
                            error_set(error, lex, json_error_invalid_syntax,
                                      "invalid Unicode escape '%.6s'", p - 1);
                            goto out;
                        }
                        p += 5;

                        if (0xDC00 <= value2 && value2 <= 0xDFFF) {
                            /* valid second surrogate */
                            value =
                                    ((value - 0xD800) << 10) + (value2 - 0xDC00) + 0x10000;
                        } else {
                            /* invalid second surrogate */
                            error_set(error, lex, json_error_invalid_syntax,
                                      "invalid Unicode '\\u%04X\\u%04X'", value, value2);
                            goto out;
                        }
                    } else {
                        /* no second surrogate */
                        error_set(error, lex, json_error_invalid_syntax,
                                  "invalid Unicode '\\u%04X'", value);
                        goto out;
                    }
                } else if (0xDC00 <= value && value <= 0xDFFF) {
                    error_set(error, lex, json_error_invalid_syntax,
                              "invalid Unicode '\\u%04X'", value);
                    goto out;
                }

                if (utf8_encode(value, t, &length))
                    assert(0);
                t += length;
            } else {
                switch (*p) {
                    case '"':
                    case '\\':
                    case '/':
                        *t = *p;
                        break;
                    case 'b':
                        *t = '\b';
                        break;
                    case 'f':
                        *t = '\f';
                        break;
                    case 'n':
                        *t = '\n';
                        break;
                    case 'r':
                        *t = '\r';
                        break;
                    case 't':
                        *t = '\t';
                        break;
                    default:
                        assert(0);
                }
                t++;
                p++;
            }
        } else
            *(t++) = *(p++);
    }
    *t = '\0';
    lex->value.string.len = t - lex->value.string.val;
    lex->token = TOKEN_STRING;
    return;

    out:
    lex_free_string(lex);
}